

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SerializeWithCachedSizes
          (ConvolutionLayerParams *this,CodedOutputStream *output)

{
  uint8 *puVar1;
  byte *pbVar2;
  bool bVar3;
  unsigned_long *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->outputchannels_,output);
  }
  if (this->kernelchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->kernelchannels_,output);
  }
  if (this->ngroups_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,this->ngroups_,output);
  }
  if (0 < (this->kernelsize_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0xa2);
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xa2;
      puVar1[1] = '\x01';
      output->buffer_ = output->buffer_ + 2;
      output->buffer_size_ = output->buffer_size_ + -2;
    }
    uVar12 = this->_kernelsize_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->kernelsize_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar2 = output->buffer_;
        pbVar7 = pbVar2;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if (0 < (this->stride_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0xf2);
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xf2;
      puVar1[1] = '\x01';
      output->buffer_ = output->buffer_ + 2;
      output->buffer_size_ = output->buffer_size_ + -2;
    }
    uVar12 = this->_stride_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->stride_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar2 = output->buffer_;
        pbVar7 = pbVar2;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if (0 < (this->dilationfactor_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x142);
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xc2;
      puVar1[1] = '\x02';
      output->buffer_ = output->buffer_ + 2;
      output->buffer_size_ = output->buffer_size_ + -2;
    }
    uVar12 = this->_dilationfactor_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->dilationfactor_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->dilationfactor_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar2 = output->buffer_;
        pbVar7 = pbVar2;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if (this->_oneof_case_[0] == 0x32) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x33) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->isdeconvolution_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,true,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x46,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5a,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5b,&this->bias_->super_MessageLite,output);
  }
  if (0 < (this->outputshape_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x322);
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xa2;
      puVar1[1] = '\x06';
      output->buffer_ = output->buffer_ + 2;
      output->buffer_size_ = output->buffer_size_ + -2;
    }
    uVar12 = this->_outputshape_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->outputshape_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar2 = output->buffer_;
        pbVar7 = pbVar2;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConvolutionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->outputchannels(), output);
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->kernelchannels(), output);
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->ngroups(), output);
  }

  // repeated uint64 kernelSize = 20;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 30;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(30, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // repeated uint64 dilationFactor = 40;
  if (this->dilationfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(40, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dilationfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->dilationfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->dilationfactor(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 50;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *ConvolutionPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 51;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *ConvolutionPaddingType_.same_, output);
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->isdeconvolution(), output);
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(70, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      90, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      91, *this->bias_, output);
  }

  // repeated uint64 outputShape = 100;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(100, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConvolutionLayerParams)
}